

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

VarValue *
deqp::gles2::Functional::generateZeroVarValue(VarValue *__return_storage_ptr__,DataType type)

{
  int i;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = glu::getDataTypeScalarSize(type);
  __return_storage_ptr__->type = type;
  if ((type - TYPE_FLOAT < 4) || (type - TYPE_FLOAT_MAT2 < 9 || type - TYPE_DOUBLE_MAT2 < 9)) {
    uVar4 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      *(undefined4 *)((long)&__return_storage_ptr__->val + uVar4 * 4) = 0;
    }
  }
  else if (type - TYPE_INT < 4) {
    uVar4 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      *(undefined4 *)((long)&__return_storage_ptr__->val + uVar4 * 4) = 0;
    }
  }
  else if (type - TYPE_BOOL < 4) {
    uVar4 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar4;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      (__return_storage_ptr__->val).boolV[uVar4] = false;
    }
  }
  else if (type - TYPE_SAMPLER_1D < 0x1e) {
    (__return_storage_ptr__->val).floatV[0] = 0.0;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      *(float *)((long)&__return_storage_ptr__->val + lVar3 * 4 + 4) = (float)(int)lVar3 * 0.12;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static VarValue generateZeroVarValue (const glu::DataType type)
{
	const int	numElems = glu::getDataTypeScalarSize(type);
	VarValue	result;
	result.type = type;

	if (glu::isDataTypeFloatOrVec(type) || glu::isDataTypeMatrix(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.floatV[i] = 0.0f;
	}
	else if (glu::isDataTypeIntOrIVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.intV[i] = 0;
	}
	else if (glu::isDataTypeBoolOrBVec(type))
	{
		for (int i = 0; i < numElems; i++)
			result.val.boolV[i] = false;
	}
	else if (glu::isDataTypeSampler(type))
	{
		result.val.samplerV.unit = 0;

		for (int i = 0; i < 4; i++)
			result.val.samplerV.fillColor[i] = 0.12f * (float)i;
	}
	else
		DE_ASSERT(false);

	return result;
}